

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inc_search_demo.cpp
# Opt level: O1

vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_> *
__thiscall
GetSquareCellNeighbour::operator()
          (vector<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>
           *__return_storage_ptr__,GetSquareCellNeighbour *this,SquareCell cell)

{
  long lVar1;
  long lVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  long lVar4;
  Index pos [4];
  long local_a0;
  double *local_98;
  SquareCell local_90;
  int64_t local_78;
  long local_70;
  int64_t local_68;
  long local_60;
  long local_58;
  int64_t local_50;
  long local_48;
  int64_t local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<SquareCell,_double>,_std::allocator<std::tuple<SquareCell,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = cell.idx.x;
  local_70 = cell.idx.y + 1;
  local_68 = cell.idx.x;
  local_60 = cell.idx.y + -1;
  local_58 = cell.idx.x + 1;
  local_50 = cell.idx.y;
  local_48 = cell.idx.x + -1;
  local_40 = cell.idx.y;
  local_98 = &this->cell_size_;
  lVar4 = 0;
  do {
    lVar1 = *(long *)((long)&local_78 + lVar4);
    if ((((-1 < lVar1) && (lVar1 < this->col_size_)) &&
        (lVar2 = *(long *)((long)&local_70 + lVar4), -1 < lVar2)) && (lVar2 < this->row_size_)) {
      local_a0 = this->col_size_ * lVar2 + lVar1;
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                        ((this->obstacle_ids_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (this->obstacle_ids_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_a0);
      if (_Var3._M_current ==
          (this->obstacle_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_90.id = local_a0;
        local_90.idx.x = lVar1;
        local_90.idx.y = lVar2;
        std::vector<std::tuple<SquareCell,double>,std::allocator<std::tuple<SquareCell,double>>>::
        emplace_back<SquareCell&,double&>
                  ((vector<std::tuple<SquareCell,double>,std::allocator<std::tuple<SquareCell,double>>>
                    *)__return_storage_ptr__,&local_90,local_98);
      }
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::tuple<SquareCell, double>> operator()(SquareCell cell) {
    std::vector<std::tuple<SquareCell, double>> adjacent_cells;

    Index pos[4];

    pos[0].x = cell.idx.x;
    pos[0].y = cell.idx.y + 1;

    pos[1].x = cell.idx.x;
    pos[1].y = cell.idx.y - 1;

    pos[2].x = cell.idx.x + 1;
    pos[2].y = cell.idx.y;

    pos[3].x = cell.idx.x - 1;
    pos[3].y = cell.idx.y;

    for (int i = 0; i < 4; i++) {
      if (pos[i].x >= 0 && pos[i].x < col_size_ && pos[i].y >= 0 &&
          pos[i].y < row_size_) {
        uint64_t new_id = pos[i].y * col_size_ + pos[i].x;

        if (std::find(obstacle_ids_.begin(), obstacle_ids_.end(), new_id) !=
            obstacle_ids_.end())
          continue;

        SquareCell ncell(new_id);
        ncell.idx.x = pos[i].x;
        ncell.idx.y = pos[i].y;

        adjacent_cells.emplace_back(ncell, cell_size_);
      }
    }

    return adjacent_cells;
  }